

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_template.hpp
# Opt level: O0

self_type * __thiscall
boost::function<void_(const_boost::debug::dbg_startup_info_&)>::operator=
          (function<void_(const_boost::debug::dbg_startup_info_&)> *this,self_type *f)

{
  function1<void,_const_boost::debug::dbg_startup_info_&> *in_RSI;
  self_type *in_RDI;
  self_type *in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffe8;
  
  function((function<void_(const_boost::debug::dbg_startup_info_&)> *)&stack0xffffffffffffffd0,
           in_stack_ffffffffffffffa8);
  function1<void,_const_boost::debug::dbg_startup_info_&>::swap
            (in_RSI,(function1<void,_const_boost::debug::dbg_startup_info_&> *)
                    in_stack_ffffffffffffffe8);
  ~function((function<void_(const_boost::debug::dbg_startup_info_&)> *)0x237e67);
  return in_RDI;
}

Assistant:

self_type& operator=(const self_type& f)
  {
    self_type(f).swap(*this);
    return *this;
  }